

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_code.hpp
# Opt level: O0

string_ref * __thiscall
system_error2::_generic_code_domain::name
          (string_ref *__return_storage_ptr__,_generic_code_domain *this)

{
  _generic_code_domain *this_local;
  
  status_code_domain::string_ref::string_ref
            (__return_storage_ptr__,"generic domain",0xffffffffffffffff,(void *)0x0,(void *)0x0,
             (void *)0x0,status_code_domain::string_ref::_checking_string_thunk);
  return __return_storage_ptr__;
}

Assistant:

virtual payload_info_t payload_info() const noexcept override
  {
    return {sizeof(value_type), sizeof(status_code_domain *) + sizeof(value_type),
            (alignof(value_type) > alignof(status_code_domain *)) ? alignof(value_type) : alignof(status_code_domain *)};
  }